

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::
PromiseDataBase<std::__cxx11::list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>,_void_(const_std::__cxx11::list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_&)>
::~PromiseDataBase(PromiseDataBase<std::__cxx11::list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>,_void_(const_std::__cxx11::list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_&)>
                   *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~PromiseDataBase() { }